

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

int64_t __thiscall LLVMBC::APInt::getSExtValue(APInt *this)

{
  IntegerType *this_00;
  TypeID TVar1;
  uint32_t uVar2;
  ulong uVar3;
  LoggingCallback p_Var4;
  void *pvVar5;
  ulong uVar6;
  char acStack_1018 [4104];
  
  this_00 = (IntegerType *)this->type;
  TVar1 = Type::getTypeID((Type *)this_00);
  if (TVar1 == IntegerTyID) {
    uVar2 = IntegerType::getBitWidth(this_00);
    if (uVar2 == 0x40) {
      uVar3 = this->value;
    }
    else {
      uVar6 = -1L << ((byte)uVar2 & 0x3f);
      uVar3 = 0;
      if ((this->value >> ((ulong)(byte)((byte)uVar2 - 1) & 0x3f) & 1) != 0) {
        uVar3 = uVar6;
      }
      uVar3 = ~uVar6 & this->value | uVar3;
    }
    return uVar3;
  }
  p_Var4 = ::dxil_spv::get_thread_log_callback();
  if (p_Var4 == (LoggingCallback)0x0) {
    getSExtValue();
    std::terminate();
  }
  builtin_strncpy(acStack_1018 + 0x10,"in cast<T>.\n",0xd);
  builtin_strncpy(acStack_1018,"Invalid type ID ",0x10);
  pvVar5 = ::dxil_spv::get_thread_log_callback_userdata();
  (*p_Var4)(pvVar5,Error,acStack_1018);
  std::terminate();
}

Assistant:

int64_t APInt::getSExtValue() const
{
	auto width = cast<IntegerType>(type)->getBitWidth();
	if (width == 64)
		return int64_t(value);
	auto mask = (1ull << width) - 1;
	bool sign_bit = ((value >> (width - 1)) & 1) != 0;
	uint64_t extended = sign_bit ? ~mask : 0ull;
	return int64_t((value & mask) | extended);
}